

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O1

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenHexNum(Lexer *this)

{
  int iVar1;
  Lexer *in_RSI;
  
  nextChar(in_RSI);
  iVar1 = isxdigit(in_RSI->currentChar);
  while (iVar1 != 0) {
    nextChar(in_RSI);
    iVar1 = isxdigit(in_RSI->currentChar);
  }
  nextTokenNumType(this,(uint64_t)in_RSI);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenHexNum() noexcept {
  nextChar(); // eat x

  size_t num = 0;
  while (std::isxdigit(currentChar)) {
    num *= 16;
    if (std::isdigit(currentChar))
      num += currentChar - '0';
    else
      num += currentChar - 'A' + 10;
    nextChar(); // eat hexadecimal digit
  }

  return nextTokenNumType(num);
}